

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswAig.c
# Opt level: O3

void Ssw_FramesConstrainNode
               (Ssw_Man_t *p,Aig_Man_t *pFrames,Aig_Man_t *pAig,Aig_Obj_t *pObj,int iFrame,
               int fTwoPos)

{
  long lVar1;
  Aig_Obj_t **ppAVar2;
  Aig_Obj_t *pAVar3;
  Aig_Obj_t *pAVar4;
  Aig_Obj_t *pAVar5;
  int iVar6;
  ulong uVar7;
  
  if (pAig != (Aig_Man_t *)0x0) {
    iVar6 = pObj->Id;
    lVar1 = *(long *)(pAig->nObjs + (long)iVar6 * 2 + -0x20);
    if (lVar1 != 0) {
      p->nConstrTotal = p->nConstrTotal + 1;
      if (iVar6 <= *(int *)(lVar1 + 0x24)) {
        __assert_fail("pObjRepr->Id < pObj->Id",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssw/sswAig.c"
                      ,0x61,
                      "void Ssw_FramesConstrainNode(Ssw_Man_t *, Aig_Man_t *, Aig_Man_t *, Aig_Obj_t *, int, int)"
                     );
      }
      ppAVar2 = p->pNodeToFrames;
      iVar6 = iVar6 * p->nFrames + iFrame;
      pAVar4 = ppAVar2[iVar6];
      pAVar5 = ppAVar2[*(int *)(lVar1 + 0x24) * p->nFrames + iFrame];
      if (((*(uint *)(lVar1 + 0x18) ^ *(uint *)&pObj->field_0x18) & 8) == 0) {
        pAVar3 = pAVar5;
        if (pAVar4 == (Aig_Obj_t *)((ulong)pAVar5 ^ 1)) {
          __assert_fail("pObjNew != Aig_Not(pObjReprNew)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssw/sswAig.c"
                        ,0x69,
                        "void Ssw_FramesConstrainNode(Ssw_Man_t *, Aig_Man_t *, Aig_Man_t *, Aig_Obj_t *, int, int)"
                       );
        }
      }
      else {
        if (pAVar4 == pAVar5) {
          __assert_fail("pObjNew != pObjReprNew",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssw/sswAig.c"
                        ,0x6f,
                        "void Ssw_FramesConstrainNode(Ssw_Man_t *, Aig_Man_t *, Aig_Man_t *, Aig_Obj_t *, int, int)"
                       );
        }
        pAVar3 = (Aig_Obj_t *)((ulong)pAVar5 ^ 1);
      }
      if (pAVar4 != pAVar3) {
        p->nConstrReduced = p->nConstrReduced + 1;
        pAVar5 = (Aig_Obj_t *)
                 ((ulong)((*(uint *)(lVar1 + 0x18) ^ *(uint *)&pObj->field_0x18) >> 3 & 1) ^
                 (ulong)pAVar5);
        ppAVar2[iVar6] = pAVar5;
        if (fTwoPos == 0) {
          pAVar4 = Aig_Exor(pFrames,pAVar4,pAVar5);
          if (pAVar4 == (Aig_Obj_t *)0x0) {
            uVar7 = 1;
          }
          else {
            uVar7 = (ulong)(((uint)pAVar4 ^
                            *(uint *)(((ulong)pAVar4 & 0xfffffffffffffffe) + 0x18) >> 3) & 1);
          }
          pAVar4 = (Aig_Obj_t *)(uVar7 ^ (ulong)pAVar4);
        }
        else {
          Aig_ObjCreateCo(pFrames,pAVar5);
        }
        Aig_ObjCreateCo(pFrames,pAVar4);
        return;
      }
    }
  }
  return;
}

Assistant:

static inline void Ssw_FramesConstrainNode( Ssw_Man_t * p, Aig_Man_t * pFrames, Aig_Man_t * pAig, Aig_Obj_t * pObj, int iFrame, int fTwoPos )
{
    Aig_Obj_t * pObjNew, * pObjNew2, * pObjRepr, * pObjReprNew, * pMiter;
    // skip nodes without representative
    pObjRepr = Aig_ObjRepr(pAig, pObj);
    if ( pObjRepr == NULL )
        return;
    p->nConstrTotal++;
    assert( pObjRepr->Id < pObj->Id );
    // get the new node
    pObjNew = Ssw_ObjFrame( p, pObj, iFrame );
    // get the new node of the representative
    pObjReprNew = Ssw_ObjFrame( p, pObjRepr, iFrame );
    // if this is the same node, no need to add constraints
    if ( pObj->fPhase == pObjRepr->fPhase )
    {
        assert( pObjNew != Aig_Not(pObjReprNew) );
        if ( pObjNew == pObjReprNew )
            return;
    }
    else
    {
        assert( pObjNew != pObjReprNew );
        if ( pObjNew == Aig_Not(pObjReprNew) )
            return;
    }
    p->nConstrReduced++;
    // these are different nodes - perform speculative reduction
    pObjNew2 = Aig_NotCond( pObjReprNew, pObj->fPhase ^ pObjRepr->fPhase );
    // set the new node
    Ssw_ObjSetFrame( p, pObj, iFrame, pObjNew2 );
    // add the constraint
    if ( fTwoPos )
    {
        Aig_ObjCreateCo( pFrames, pObjNew2 );
        Aig_ObjCreateCo( pFrames, pObjNew );
    }
    else
    {
        pMiter = Aig_Exor( pFrames, pObjNew, pObjNew2 );
        Aig_ObjCreateCo( pFrames, Aig_NotCond(pMiter, Aig_ObjPhaseReal(pMiter)) );
    }
}